

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O3

void __thiscall ProcessesView::ProcessesView(ProcessesView *this,QWidget *parent)

{
  QStandardItemModel *this_00;
  Worker *pWVar1;
  undefined4 *puVar2;
  int i;
  int iVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QString local_88;
  QArrayData *local_68;
  ImplFn p_Stack_60;
  qsizetype local_58;
  QStringList horizontalHeader;
  QObject local_28 [8];
  
  QTreeView::QTreeView(&this->super_QTreeView,parent);
  *(undefined ***)this = &PTR_metaObject_0012bd90;
  *(undefined ***)&this->field_0x10 = &PTR__ProcessesView_0012c0b0;
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,(QObject *)0x0);
  horizontalHeader.d.d = (Data *)0x0;
  horizontalHeader.d.ptr = (QString *)0x0;
  horizontalHeader.d.size = 0;
  QVar4.m_data = (storage_type *)0xf;
  QVar4.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar4);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar5.m_data = (storage_type *)0xa;
  QVar5.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar5);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar6.m_data = (storage_type *)0x6;
  QVar6.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar6);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar7.m_data = (storage_type *)0xa;
  QVar7.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar7);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar8.m_data = (storage_type *)0x11;
  QVar8.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar8);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar9.m_data = (storage_type *)0xb;
  QVar9.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar9);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar10.m_data = (storage_type *)0x10;
  QVar10.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar10);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar11.m_data = (storage_type *)0xc;
  QVar11.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar11);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QVar12.m_data = (storage_type *)0xc;
  QVar12.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar12);
  local_88.d.d = (Data *)local_68;
  local_88.d.ptr = (char16_t *)p_Stack_60;
  local_88.d.size = local_58;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&horizontalHeader,horizontalHeader.d.size,&local_88);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
    }
  }
  QStandardItemModel::setHorizontalHeaderLabels((QList *)this_00);
  (**(code **)(*(long *)this + 0x1c8))(this,this_00);
  iVar3 = 0;
  do {
    QTreeView::resizeColumnToContents((int)this);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 9);
  QAbstractItemView::setEditTriggers(this,0);
  QAbstractItemView::setAutoScroll(SUB81(this,0));
  QTreeView::setRootIsDecorated(SUB81(this,0));
  pWVar1 = InfoProvider::getWorker();
  local_68 = (QArrayData *)Worker::dataUpdated;
  p_Stack_60 = (ImplFn)0x0;
  local_88.d.d = (Data *)onDataUpdated;
  local_88.d.ptr = (char16_t *)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(ProcessesView::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = onDataUpdated;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_28,(void **)pWVar1,(QObject *)&local_68,(void **)this,
             (QSlotObjectBase *)&local_88,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  QArrayDataPointer<QString>::~QArrayDataPointer(&horizontalHeader.d);
  return;
}

Assistant:

ProcessesView::ProcessesView(QWidget *parent): QTreeView(parent) {
    auto *model = new QStandardItemModel();

    // Column titles
    QStringList horizontalHeader;
    horizontalHeader.append("Name of Process"); // Longer header increases column width so the process names are visible
    horizontalHeader.append("Type (C/G)");
    horizontalHeader.append("GPU ID");
    horizontalHeader.append("Process ID");
    horizontalHeader.append("FB Mem Usage (MB)");
    horizontalHeader.append("SM Util (%)");
    horizontalHeader.append("GPU Mem Util (%)");
    horizontalHeader.append("Encoding (%)");
    horizontalHeader.append("Decoding (%)");

    model->setHorizontalHeaderLabels(horizontalHeader);

    setModel(model);

    for (int i = 0; i < NVSMColumns::columns_count; i++)
        resizeColumnToContents(i);

    setEditTriggers(QAbstractItemView::NoEditTriggers);
    setAutoScroll(false);
    setRootIsDecorated(false);

    connect(InfoProvider::getWorker(), &InfoProvider::Worker::dataUpdated, this, &ProcessesView::onDataUpdated);
}